

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompilationcontext.cpp
# Opt level: O3

void __thiscall
SQCompilation::SQCompilationContext::SQCompilationContext
          (SQCompilationContext *this,SQVM *vm,Arena *arena,SQChar *sn,char *code,size_t csize,
          Comments *comments,bool raiseError)

{
  SQAllocContext pSVar1;
  
  this->_sourceName = sn;
  this->_vm = vm;
  this->_code = code;
  this->_codeSize = csize;
  memset(this->_errorjmp,0,200);
  this->_arena = arena;
  this->_raiseError = raiseError;
  pSVar1 = vm->_sharedstate->_alloc_ctx;
  (this->_linemap)._vals = (int *)0x0;
  (this->_linemap)._alloc_ctx = pSVar1;
  (this->_linemap)._size = 0;
  (this->_linemap)._allocated = 0;
  this->_comments = comments;
  return;
}

Assistant:

SQCompilationContext::SQCompilationContext(SQVM *vm, Arena *arena, const SQChar *sn, const char *code, size_t csize, const Comments *comments, bool raiseError)
  : _vm(vm)
  , _arena(arena)
  , _sourceName(sn)
  , _linemap(_ss(vm)->_alloc_ctx)
  , _comments(comments)
  , _code(code)
  , _codeSize(csize)
  , _raiseError(raiseError)
  , _errorjmp()
{
}